

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simultan.c
# Opt level: O3

void massage_linblk(Item *q1,Item *q2,Item *q3,Item *q4,int sensused)

{
  Symbol *pSVar1;
  List *pLVar2;
  List *pLVar3;
  long lVar4;
  
  nlineq = nlineq + 1;
  if (nlineq == 0) {
    diag(linblk->name," has no equations");
  }
  sprintf(buf,"static void %s();\n",((q2->element).sym)->name);
  linsertstr(procfunc,buf);
  replacstr(q1,"\nstatic void");
  insertstr(q3,"()\n");
  insertstr(q3->next," int _counte = -1;\n");
  pSVar1 = linblk;
  linblk->subtype = linblk->subtype | 0x10000;
  (pSVar1->u).i = numlist;
  lVar4 = 0x41;
  do {
    pLVar2 = symlist[lVar4];
    for (pLVar3 = pLVar2->next; pLVar3 != pLVar2; pLVar3 = pLVar3->next) {
      pSVar1 = (pLVar3->element).sym;
      if (((pSVar1->type == 0x13e) && ((pSVar1->subtype & 0x10) != 0)) && (pSVar1->used != 0)) {
        if (sensused != 0) {
          add_sens_statelist(pSVar1);
          pLVar2 = symlist[lVar4];
        }
        pSVar1->used = 0;
      }
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x7b);
  if (using_array == '\0') {
    if (nlineq != nstate) {
      sprintf(buf,"Number states, %d, unequal to equations, %d in ");
      diag(buf,linblk->name);
    }
  }
  else {
    sprintf(buf,
            "if(_counte != %d) printf( \"Number of equations, %%d, does not equal number of states, %d\", _counte + 1);\n"
            ,(ulong)(nstate - 1));
    insertstr(q4,buf);
  }
  linblk->used = nstate;
  sprintf(buf,"static double **_coef%d;\n",(ulong)(uint)numlist);
  linsertstr(procfunc,buf);
  sprintf(buf,"_slist%d",(ulong)(uint)numlist);
  add_global_var("int",buf,0,1,(sens_parm + 1) * nstate,1);
  sprintf(buf,"\n#define _RHS%d(arg) _coef%d[arg][%d]\n",(ulong)(uint)numlist,(ulong)(uint)numlist,
          (ulong)(uint)nstate);
  linsertstr(procfunc,buf);
  sprintf(buf,"if (_first) _coef%d = makematrix(%d, %d);\n",(ulong)(uint)numlist,(ulong)(uint)nstate
          ,(ulong)(nstate + 1));
  lappendstr(initlist,buf);
  sprintf(buf,"zero_matrix(_coef%d, %d, %d);\n{\n",(ulong)(uint)numlist,(ulong)(uint)nstate,
          (ulong)(nstate + 1));
  insertstr(q3->next,buf);
  insertstr(q4,"\n}\n");
  movelist(q1,q4,procfunc);
  if (sensused != 0) {
    sensmassage(0x125,q2,numlist);
  }
  nstate = 0;
  nlineq = 0;
  return;
}

Assistant:

void massage_linblk(q1, q2, q3, q4, sensused) /* LINEAR NAME stmtlist '}' */
	Item *q1, *q2, *q3, *q4;
	int sensused;
{
	Item *qs;
	Symbol *s;
	int i;
	
#if LINT
assert(q2);
#endif
	if (++nlineq == 0) {
		diag(linblk->name, " has no equations");
	}
	Sprintf(buf, "static void %s();\n", SYM(q2)->name);
	Linsertstr(procfunc, buf);
	replacstr(q1, "\nstatic void"); Insertstr(q3, "()\n");
	Insertstr(q3->next, " int _counte = -1;\n");
	linblk->subtype |= LINF;
	linblk->u.i = numlist;
	SYMITER(NAME){
		if ((s->subtype &STAT) && s->used) {
			if (sensused) {
				add_sens_statelist(s);
			}
			s->used = 0;
		}
	}
	if (!using_array) {
		if (nlineq != nstate) {
Sprintf(buf,"Number states, %d, unequal to equations, %d in ", nstate, nlineq);
			diag(buf, linblk->name);
		}
	} else {
#if 1	/* can give message when running */
Sprintf(buf, "if(_counte != %d) printf( \"Number of equations, %%d,\
 does not equal number of states, %d\", _counte + 1);\n",
			nstate-1, nstate);
		Insertstr(q4, buf);
#endif
	}
	linblk->used = nstate;
	Sprintf(buf, "static double **_coef%d;\n", numlist);
	Linsertstr(procfunc, buf);

	Sprintf(buf, "_slist%d", numlist);
	add_global_var("int", buf, 0, 1, nstate*(1 + sens_parm), 1);

	Sprintf(buf, "\n#define _RHS%d(arg) _coef%d[arg][%d]\n",
		numlist, numlist, nstate);
	Linsertstr(procfunc, buf);
	Sprintf(buf, "if (_first) _coef%d = makematrix(%d, %d);\n",
		numlist, nstate, nstate+1);
	Lappendstr(initlist, buf);
	Sprintf(buf, "zero_matrix(_coef%d, %d, %d);\n{\n",
		numlist, nstate, nstate+1);
	Insertstr(q3->next, buf);
	Insertstr(q4, "\n}\n");
	movelist(q1, q4, procfunc);
	if (sensused) {
		sensmassage(LINEAR, q2, numlist);
	}
	nstate = 0; nlineq = 0;
}